

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chan.h
# Opt level: O3

int __thiscall
dap::Chan<std::function<void_()>_>::close(Chan<std::function<void_()>_> *this,int __fd)

{
  int extraout_EAX;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->mutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  this->closed = true;
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return extraout_EAX;
}

Assistant:

void Chan<T>::close() {
  std::unique_lock<std::mutex> lock(mutex);
  closed = true;
  cv.notify_all();
}